

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O3

int __thiscall
CVmObjTads::getp_get_method(CVmObjTads *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_prop_id_t vVar1;
  int iVar2;
  uint uVar3;
  vm_datatype_t vVar4;
  vm_obj_id_t source_obj;
  tadsobj_sc_search_ctx curpos;
  vm_obj_id_t local_3c;
  tadsobj_sc_search_ctx local_38;
  
  if (getp_get_method(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_get_method();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_get_method::desc);
  if (iVar2 == 0) {
    vVar1 = CVmBif::pop_propid_val();
    local_38.curhdr = (vm_tadsobj_hdr *)(this->super_CVmObject).ext_;
    local_38.path_sc = (tadsobj_objid_and_ptr *)0x0;
    local_38.cur = self;
    iVar2 = tadsobj_sc_search_ctx::find_prop(&local_38,(uint)vVar1,retval,&local_3c);
    vVar4 = VM_NIL;
    if ((iVar2 != 0) && (uVar3 = retval->typ - VM_DSTRING, uVar3 < 10)) {
      vVar4 = *(vm_datatype_t *)(&DAT_002c4c3c + (ulong)uVar3 * 4);
    }
    retval->typ = vVar4;
  }
  return 1;
}

Assistant:

int CVmObjTads::getp_get_method(VMG_ vm_obj_id_t self,
                                vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(1);

    /* check arguments: getMethod(&propid) */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* retrieve the property ID */
    vm_obj_id_t prop = CVmBif::pop_propid_val(vmg0_);

    /* find the property */
    vm_obj_id_t source_obj;
    tadsobj_sc_search_ctx curpos(vmg_ self, this);
    if (curpos.find_prop(vmg_ prop, retval, &source_obj))
    {
        /* the property is definfed - check its type */
        switch (retval->typ)
        {
        case VM_CODEOFS:
            /* it's a direct call to code - convert to a function pointer */
            retval->typ = VM_FUNCPTR;
            break;

        case VM_DSTRING:
            /* it's a self-printing constant string - convert to string */
            retval->typ = VM_SSTRING;
            break;

        case VM_OBJX:
            /* 
             *   It's an executable object, which is either a self-printing
             *   non-constant string or an execute-on-invoke anonymous
             *   function.  In either case, simply convert it back to an
             *   ordinary value. 
             */
            retval->typ = VM_OBJ;
            break;

        case VM_BIFPTRX:
            /* 
             *   executable built-in function pointer - convert back to a
             *   regular bif pointer 
             */
            retval->typ = VM_BIFPTR;
            break;

        default:
            /* other types aren't executable methods, so return nil */
            retval->set_nil();
            break;
        }
    }
    else
    {
        /* this property isn't defined - return nil */
        retval->set_nil();
    }

    /* handled */
    return TRUE;
}